

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O1

Qiniu_Error
Qiniu_RS_BatchDeleteAfterDays
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryDeleteAfterDays *entries,
          Qiniu_ItemCount entryCount)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *s1;
  char *__s;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar6;
  Qiniu_Int64 QVar7;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  Qiniu_Error QVar12;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  char *pcVar8;
  
  QVar12 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_40);
  pcVar8 = QVar12.message;
  uVar1 = QVar12.code;
  if (uVar1 == 200) {
    pcVar4 = Qiniu_String_Concat2(local_40,"/batch");
    if (entryCount < 1) {
      pcVar5 = (char *)0x0;
    }
    else {
      lVar10 = 0;
      pcVar8 = (char *)0x0;
      do {
        pcVar5 = Qiniu_String_Concat3
                           (*(char **)((long)&entries->bucket + lVar10),":",
                            *(char **)((long)&entries->key + lVar10));
        s1 = Qiniu_String_Encode(pcVar5);
        iVar2 = snprintf((char *)0x0,0,"%d",(ulong)*(uint *)((long)&entries->days + lVar10));
        __s = (char *)malloc((long)(iVar2 + 1));
        snprintf(__s,(long)(iVar2 + 1),"%d",(ulong)*(uint *)((long)&entries->days + lVar10));
        s2 = Qiniu_String_Concat(s1,"/",__s,0);
        s3 = Qiniu_String_Concat2("op=/deleteAfterDays/",s2);
        Qiniu_Free(pcVar5);
        Qiniu_Free(s1);
        Qiniu_Free(__s);
        Qiniu_Free(s2);
        pcVar5 = s3;
        if (pcVar8 != (char *)0x0) {
          pcVar5 = Qiniu_String_Concat3(pcVar8,"&",s3);
          free(s3);
        }
        free(pcVar8);
        lVar10 = lVar10 + 0x18;
        pcVar8 = pcVar5;
      } while ((ulong)(uint)entryCount * 0x18 != lVar10);
    }
    bodyLen = strlen(pcVar5);
    QVar12 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar4,pcVar5,bodyLen,"application/x-www-form-urlencoded");
    pcVar8 = QVar12.message;
    uVar1 = QVar12.code;
    free(pcVar4);
    free(pcVar5);
    uVar3 = cJSON_GetArraySize(local_38);
    if (0 < (int)uVar3) {
      piVar9 = &rets->code;
      uVar11 = 0;
      do {
        pcVar6 = cJSON_GetArrayItem(local_38,(int)uVar11);
        QVar7 = Qiniu_Json_GetInt64(pcVar6,"code",0);
        pcVar6 = cJSON_GetObjectItem(pcVar6,"data");
        *piVar9 = (int)QVar7;
        if ((int)QVar7 != 200) {
          pcVar4 = Qiniu_Json_GetString(pcVar6,"error",(char *)0x0);
          ((Qiniu_RS_BatchItemRet *)(piVar9 + -2))->error = pcVar4;
        }
        uVar11 = uVar11 + 1;
        piVar9 = piVar9 + 4;
      } while (uVar3 != uVar11);
    }
  }
  QVar12._4_4_ = 0;
  QVar12.code = uVar1;
  QVar12.message = pcVar8;
  return QVar12;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchDeleteAfterDays(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                          Qiniu_RS_EntryDeleteAfterDays *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *daysStr, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryDeleteAfterDays *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);

        size_t daysLen = snprintf(NULL, 0, "%d", entry->days) + 1;
        daysStr = (char *)malloc(sizeof(char) * daysLen);
        snprintf(daysStr, daysLen, "%d", entry->days);

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/", daysStr, NULL);
        opBody = Qiniu_String_Concat2("op=/deleteAfterDays/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(daysStr);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}